

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

char * curl_pushheader_bynum(curl_pushheaders *h,size_t num)

{
  Curl_easy *pCVar1;
  RTSP *pRVar2;
  void *pvVar3;
  
  if ((((h != (curl_pushheaders *)0x0) && (pCVar1 = h->data, pCVar1 != (Curl_easy *)0x0)) &&
      (pCVar1->magic == 0xc0dedbad)) &&
     (((pRVar2 = (pCVar1->req).p.rtsp, pRVar2 != (RTSP *)0x0 &&
       (pvVar3 = (pRVar2->http_wrapper).h2_ctx, pvVar3 != (void *)0x0)) &&
      (num < *(ulong *)((long)pvVar3 + 0x130))))) {
    return *(char **)(*(long *)((long)pvVar3 + 0x128) + num * 8);
  }
  return (char *)0x0;
}

Assistant:

char *curl_pushheader_bynum(struct curl_pushheaders *h, size_t num)
{
  /* Verify that we got a good easy handle in the push header struct, mostly to
     detect rubbish input fast(er). */
  if(!h || !GOOD_EASY_HANDLE(h->data))
    return NULL;
  else {
    struct stream_ctx *stream = H2_STREAM_CTX(h->data);
    if(stream && num < stream->push_headers_used)
      return stream->push_headers[num];
  }
  return NULL;
}